

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::DeleteDegenerateFaces(dgPolyhedra *this,HaF64 *pool,HaI32 strideInBytes,HaF64 area)

{
  dgTreeNode *this_00;
  void *__ptr;
  dgRedBackNode *pdVar1;
  ulong uVar2;
  int iVar3;
  dgEdge *face;
  dgEdge *this_01;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  dgBigVector normal;
  Iterator local_60;
  dgBigVector local_50;
  
  iVar3 = (this->super_dgTree<dgEdge,_long>).m_count;
  if (iVar3 != 0) {
    this_01 = (dgEdge *)pool;
    __ptr = malloc((long)((iVar3 / 2) * 8 + 800));
    if (iVar3 / 2 != -100 && iVar3 < -199) {
      __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                    ,0x60,
                    "T &dgStack<dgTree<dgEdge, long>::dgTreeNode *>::operator[](hacd::HaI32) [T = dgTree<dgEdge, long>::dgTreeNode *]"
                   );
    }
    iVar3 = this->m_edgeMark + 1;
    this->m_edgeMark = iVar3;
    if (iVar3 == 0x7fffffff) {
      __assert_fail("m_edgeMark < 0x7fffffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                    ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
    }
    uVar4 = 0;
    this_00 = (this->super_dgTree<dgEdge,_long>).m_head;
    local_60.m_tree = &this->super_dgTree<dgEdge,_long>;
    if (this_00 == (dgTreeNode *)0x0) {
      local_60.m_ptr = (dgRedBackNode *)0x0;
    }
    else {
      local_60.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    }
    if (local_60.m_ptr != (dgRedBackNode *)0x0) {
      uVar4 = 0;
      do {
        if ((*(int *)&local_60.m_ptr[2]._vptr_dgRedBackNode != iVar3) &&
           (0 < *(int *)((long)&local_60.m_ptr[1]._vptr_dgRedBackNode + 4))) {
          *(dgRedBackNode **)((long)__ptr + (long)(int)uVar4 * 8) = local_60.m_ptr;
          pdVar1 = local_60.m_ptr + 1;
          do {
            *(int *)&pdVar1[1]._vptr_dgRedBackNode = iVar3;
            pdVar1 = pdVar1->m_right;
          } while (pdVar1 != local_60.m_ptr + 1);
          uVar4 = uVar4 + 1;
        }
        this_01 = (dgEdge *)0x0;
        dgTree<dgEdge,_long>::Iterator::operator++(&local_60,0);
      } while (local_60.m_ptr != (dgRedBackNode *)0x0);
    }
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        face = (dgEdge *)(*(long *)((long)__ptr + uVar2 * 8) + 0x28);
        FaceNormal(&local_50,(dgPolyhedra *)this_01,face,pool,strideInBytes);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_50.super_dgTemplateVector<double>.m_x;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_50.super_dgTemplateVector<double>.m_z;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_50.super_dgTemplateVector<double>.m_y *
                       local_50.super_dgTemplateVector<double>.m_y;
        auVar5 = vfmadd231sd_fma(auVar6,auVar5,auVar5);
        auVar5 = vfmadd213sd_fma(auVar7,auVar7,auVar5);
        if (auVar5._0_8_ < (double)area * (double)area * 4.0) {
          DeleteFace(this,face);
          this_01 = face;
        }
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void dgPolyhedra::DeleteDegenerateFaces (const hacd::HaF64* const pool, hacd::HaI32 strideInBytes, hacd::HaF64 area)
{
	if (!GetCount()) {
		return;
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
	dgStack <dgPolyhedra::dgTreeNode*> faceArrayPool(GetCount() / 2 + 100);

	hacd::HaI32 count = 0;
	dgPolyhedra::dgTreeNode** const faceArray = &faceArrayPool[0];
	hacd::HaI32 mark = IncLRU();
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);

		if ((edge->m_mark != mark) && (edge->m_incidentFace > 0)) {
			faceArray[count] = iter.GetNode();
			count ++;
			dgEdge* ptr = edge;
			do	{
				ptr->m_mark = mark;
				ptr = ptr->m_next;
			} while (ptr != edge);
		}
	}

	hacd::HaF64 area2 = area * area;
	area2 *= hacd::HaF64 (4.0f);

	for (hacd::HaI32 i = 0; i < count; i ++) {
		dgPolyhedra::dgTreeNode* const faceNode = faceArray[i];
		dgEdge* const edge = &faceNode->GetInfo();

		dgBigVector normal (FaceNormal (edge, pool, strideInBytes));

		hacd::HaF64 faceArea = normal % normal;
		if (faceArea < area2) {
			DeleteFace (edge);
		}
	}

#ifdef __ENABLE_SANITY_CHECK 
	mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if ((edge->m_mark != mark) && (edge->m_incidentFace > 0)) {
			//HACD_ASSERT (edge->m_next->m_next->m_next == edge);
			dgEdge* ptr = edge;
			do	{
				ptr->m_mark = mark;
				ptr = ptr->m_next;
			} while (ptr != edge);

			dgBigVector normal (FaceNormal (edge, pool, strideInBytes));

			hacd::HaF64 faceArea = normal % normal;
			HACD_ASSERT (faceArea >= area2);
		}
	}
	HACD_ASSERT (SanityCheck ());
#endif
}